

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorShower::hsvEd(QColorShower *this)

{
  QLineEdit *this_00;
  int iVar1;
  uint uVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  undefined4 local_38;
  undefined2 local_34;
  undefined6 local_32;
  undefined2 uStack_2c;
  undefined2 uStack_2a;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this->rgbOriginal = false;
  iVar1 = QSpinBox::value(&this->hEd->super_QSpinBox);
  this->hue = iVar1;
  iVar1 = QSpinBox::value(&this->sEd->super_QSpinBox);
  this->sat = iVar1;
  iVar1 = QSpinBox::value(&this->vEd->super_QSpinBox);
  this->val = iVar1;
  uStack_2a = 0xaaaa;
  local_38 = 0;
  local_34 = 0xffff;
  local_32 = 0;
  uStack_2c = 0;
  QColor::setHsv((int)&local_38,this->hue,this->sat,iVar1);
  uVar2 = QColor::rgb();
  this->curCol = uVar2;
  QColSpinBox::setValue(this->rEd,uVar2 >> 0x10 & 0xff);
  QColSpinBox::setValue(this->gEd,(uint)*(byte *)((long)&this->curCol + 1));
  QColSpinBox::setValue(this->bEd,(uint)(byte)this->curCol);
  this_00 = this->htEd;
  QColor::name((NameFormat)&local_50);
  QLineEdit::setText(this_00,(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  showCurrentColor(this);
  newCol(this,this->curCol);
  updateQColor(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShower::hsvEd()
{
    rgbOriginal = false;
    hue = hEd->value();
    sat = sEd->value();
    val = vEd->value();

    QColor c;
    c.setHsv(hue, sat, val);
    curCol = c.rgb();

    rEd->setValue(qRed(currentColor()));
    gEd->setValue(qGreen(currentColor()));
    bEd->setValue(qBlue(currentColor()));

    htEd->setText(c.name());

    showCurrentColor();
    emit newCol(currentColor());
    updateQColor();
}